

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O0

Array * __thiscall
tf::UnboundedTaskQueue<tf::Node_*>::resize_array
          (UnboundedTaskQueue<tf::Node_*> *this,Array *a,int64_t b,int64_t t)

{
  Array *__p;
  vector<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
  *in_RCX;
  undefined8 in_RDI;
  int64_t unaff_retaddr;
  int64_t in_stack_00000008;
  Array *tmp;
  memory_order __m;
  
  __m = (memory_order)((ulong)in_RDI >> 0x20);
  __p = Array::resize(tmp,in_stack_00000008,unaff_retaddr);
  std::
  vector<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
  ::push_back(in_RCX,(value_type *)__p);
  std::atomic<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>::store
            ((atomic<tf::UnboundedTaskQueue<tf::Node_*>::Array_*> *)in_RCX,__p,__m);
  return __p;
}

Assistant:

typename UnboundedTaskQueue<T>::Array*
UnboundedTaskQueue<T>::resize_array(Array* a, int64_t b, int64_t t) {

  //Array* tmp = a->resize(b, t);
  //_garbage.push_back(a);
  //std::swap(a, tmp);
  //_array.store(a, std::memory_order_release);
  //// Note: the original paper using relaxed causes t-san to complain
  ////_array.store(a, std::memory_order_relaxed);
  //return a;
  

  Array* tmp = a->resize(b, t);
  _garbage.push_back(a);
  _array.store(tmp, std::memory_order_release);
  // Note: the original paper using relaxed causes t-san to complain
  //_array.store(a, std::memory_order_relaxed);
  return tmp;
}